

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::TextureGatherInstance::setupDefaultInputs(TextureGatherInstance *this)

{
  long lVar1;
  deUint32 sizePerElement;
  VkFormat format;
  bool bVar2;
  vector<float,_std::allocator<float>_> texCoord;
  float normalizedCoord [8];
  float position [8];
  
  position[4] = 1.0;
  position[5] = -1.0;
  position._24_8_ = &DAT_3f8000003f800000;
  position[0] = -1.0;
  position[1] = -1.0;
  position[2] = -1.0;
  position[3] = 1.0;
  normalizedCoord[4] = 1.0;
  normalizedCoord[5] = 0.0;
  normalizedCoord._24_8_ = &DAT_3f8000003f800000;
  normalizedCoord[0] = 0.0;
  normalizedCoord[1] = 0.0;
  normalizedCoord[2] = 0.0;
  normalizedCoord[3] = 1.0;
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[10])
            (&texCoord,this,(ulong)(uint)this->m_currentIteration);
  bVar2 = true;
  if ((this->m_baseParams).gatherType != GATHERTYPE_OFFSET_DYNAMIC) {
    bVar2 = ((this->m_baseParams).textureFormat.order - D & 0xfffffffd) == 0;
  }
  sizePerElement = 8;
  format = VK_FORMAT_R32G32_SFLOAT;
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32_SFLOAT,8,4,position);
  lVar1 = (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if (lVar1 == 0xc) {
    sizePerElement = 0xc;
    format = VK_FORMAT_R32G32B32_SFLOAT;
  }
  else if (lVar1 != 8) goto LAB_00628058;
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,1,format,sizePerElement,4,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
LAB_00628058:
  if (bVar2) {
    ShaderRenderCaseInstance::addAttribute
              (&this->super_ShaderRenderCaseInstance,2,VK_FORMAT_R32G32_SFLOAT,8,4,normalizedCoord);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void TextureGatherInstance::setupDefaultInputs (void)
{
	const int				numVertices						= 4;
	const float				position[4*2]					=
	{
		-1.0f, -1.0f,
		-1.0f, +1.0f,
		+1.0f, -1.0f,
		+1.0f, +1.0f,
	};
	const float				normalizedCoord[4*2]			=
	{
		0.0f, 0.0f,
		0.0f, 1.0f,
		1.0f, 0.0f,
		1.0f, 1.0f,
	};
	const vector<float>		texCoord						= computeQuadTexCoord(m_currentIteration);
	const bool				needNormalizedCoordInShader		= m_baseParams.gatherType == GATHERTYPE_OFFSET_DYNAMIC || isDepthFormat(m_baseParams.textureFormat);

	addAttribute(0u, vk::VK_FORMAT_R32G32_SFLOAT, 2 * (deUint32)sizeof(float), numVertices, position);

	if (texCoord.size() == 2*4)
		addAttribute(1u, vk::VK_FORMAT_R32G32_SFLOAT, 2 * (deUint32)sizeof(float), numVertices, texCoord.data());
	else if (texCoord.size() == 3*4)
		addAttribute(1u, vk::VK_FORMAT_R32G32B32_SFLOAT, 3 * (deUint32)sizeof(float), numVertices, texCoord.data());
	else
		DE_ASSERT(false);

	if (needNormalizedCoordInShader)
		addAttribute(2u, vk::VK_FORMAT_R32G32_SFLOAT, 2 * (deUint32)sizeof(float), numVertices, normalizedCoord);
}